

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::GetTargetSets
          (cmGlobalGenerator *this,TargetDependSet *projectTargets,TargetDependSet *originalTargets,
          cmLocalGenerator *root,GeneratorVector *generators)

{
  pointer ppcVar1;
  pointer ppcVar2;
  cmGlobalGenerator *target;
  bool bVar3;
  cmLocalGenerator *pcVar4;
  pointer ppcVar5;
  cmGlobalGenerator *this_00;
  pointer ppcVar6;
  cmTargetDepend local_50;
  
  ppcVar1 = (generators->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = this;
  for (ppcVar6 = (generators->
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                 _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1; ppcVar6 = ppcVar6 + 1
      ) {
    pcVar4 = *ppcVar6;
    bVar3 = IsExcluded(this_00,root,pcVar4);
    if (!bVar3) {
      ppcVar2 = (pcVar4->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar5 = (pcVar4->GeneratorTargets).
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar2;
          ppcVar5 = ppcVar5 + 1) {
        target = (cmGlobalGenerator *)*ppcVar5;
        bVar3 = IsRootOnlyTarget(this,(cmGeneratorTarget *)target);
        if ((!bVar3) ||
           (this_00 = target,
           pcVar4 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)target),
           pcVar4 == root)) {
          local_50.Link = false;
          local_50.Util = false;
          local_50.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_50.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_50.Target = (cmGeneratorTarget *)target;
          std::
          _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
          ::_M_insert_unique<cmTargetDepend>
                    ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                      *)originalTargets,&local_50);
          if (local_50.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.Backtrace.TopEntry.
                       super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          this_00 = this;
          AddTargetDepends(this,(cmGeneratorTarget *)target,projectTargets);
        }
      }
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::GetTargetSets(TargetDependSet& projectTargets,
                                      TargetDependSet& originalTargets,
                                      cmLocalGenerator* root,
                                      GeneratorVector const& generators)
{
  // loop over all local generators
  for (cmLocalGenerator* generator : generators) {
    // check to make sure generator is not excluded
    if (this->IsExcluded(root, generator)) {
      continue;
    }
    // Get the targets in the makefile
    const std::vector<cmGeneratorTarget*>& tgts =
      generator->GetGeneratorTargets();
    // loop over all the targets
    for (cmGeneratorTarget* target : tgts) {
      if (this->IsRootOnlyTarget(target) &&
          target->GetLocalGenerator() != root) {
        continue;
      }
      // put the target in the set of original targets
      originalTargets.insert(target);
      // Get the set of targets that depend on target
      this->AddTargetDepends(target, projectTargets);
    }
  }
}